

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

shared_ptr<gui::Slider> __thiscall gui::Slider::create(Slider *this,Theme *theme,String *name)

{
  Slider *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::Slider> sVar1;
  locale alStack_68 [8];
  shared_ptr<gui::SliderStyle> local_60;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_50
  ;
  
  this_00 = (Slider *)operator_new(0x260);
  std::locale::locale(alStack_68);
  sf::String::String((String *)&local_50,"Slider",alStack_68);
  Theme::getStyle<gui::SliderStyle>((Theme *)&local_60,(String *)theme);
  Slider(this_00,&local_60,name);
  std::__shared_ptr<gui::Slider,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Slider,void>
            ((__shared_ptr<gui::Slider,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_50);
  std::locale::~locale(alStack_68);
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Slider>)sVar1.super___shared_ptr<gui::Slider,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Slider> Slider::create(const Theme& theme, const sf::String& name) {
    return std::shared_ptr<Slider>(new Slider(theme.getStyle<SliderStyle>("Slider"), name));
}